

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

string_view __thiscall wabt::WastLexer::GetText(WastLexer *this,size_t offset)

{
  char *pcVar1;
  size_t sVar3;
  string_view sVar4;
  char *pcVar2;
  
  pcVar1 = this->token_start_ + offset;
  sVar3 = 0;
  pcVar2 = (char *)0x0;
  if (pcVar1 < this->buffer_end_) {
    sVar3 = 0;
    pcVar2 = (char *)0x0;
    if (pcVar1 < this->cursor_) {
      sVar3 = (long)this->cursor_ - (long)(this->token_start_ + offset);
      pcVar2 = pcVar1;
    }
  }
  sVar4._M_str = pcVar2;
  sVar4._M_len = sVar3;
  return sVar4;
}

Assistant:

std::string_view WastLexer::GetText(size_t offset) {
  // Bounds checks are necessary because token_start may have been moved
  // (e.g. if GetStringToken found a newline and reset token_start to
  // point at it).

  if (token_start_ + offset >= buffer_end_)
    return {};

  if (cursor_ <= token_start_ + offset)
    return {};

  return std::string_view(token_start_ + offset,
                          (cursor_ - token_start_) - offset);
}